

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_string(jit_State *J,RecordFFData *rd)

{
  uint sp;
  long *plVar1;
  IRRef1 IVar2;
  TRef TVar4;
  TRef TVar3;
  
  TVar4 = *J->base;
  if (TVar4 != 0) {
    plVar1 = *(long **)&J[-1].penalty[0x3c].val;
    sp = J->base[1];
    if ((sp & 0x1f000000) == 0) {
      TVar4 = crec_ct_tv(J,(CType *)(*plVar1 + 0x1c8),0,TVar4,rd->argv);
      TVar3 = lj_ir_call(J,IRCALL_strlen,(ulong)TVar4);
      IVar2 = (IRRef1)TVar3;
    }
    else {
      TVar3 = crec_ct_tv(J,(CType *)(*plVar1 + 0xd8),0,sp,rd->argv + 1);
      IVar2 = (IRRef1)TVar3;
      TVar4 = crec_ct_tv(J,(CType *)(*plVar1 + 0x1b0),0,TVar4,rd->argv);
    }
    (J->fold).ins.field_0.ot = 0x5004;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = IVar2;
    TVar4 = lj_opt_fold(J);
    *J->base = TVar4;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_string(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = J->base[0];
  if (tr) {
    TRef trlen = J->base[1];
    if (!tref_isnil(trlen)) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[1]);
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, tr, &rd->argv[0]);
    } else {
      tr = crec_ct_tv(J, ctype_get(cts, CTID_P_CCHAR), 0, tr, &rd->argv[0]);
      trlen = lj_ir_call(J, IRCALL_strlen, tr);
    }
    J->base[0] = emitir(IRT(IR_XSNEW, IRT_STR), tr, trlen);
  }  /* else: interpreter will throw. */
}